

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O0

size_t ggml_hash_find(ggml_hash_set *hash_set,ggml_tensor *key)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  ggml_tensor *in_RSI;
  ulong *in_RDI;
  bool bVar4;
  size_t i;
  size_t h;
  size_t local_28;
  
  sVar3 = ggml_hash(in_RSI);
  uVar1 = *in_RDI;
  local_28 = sVar3 % uVar1;
  while( true ) {
    bVar2 = ggml_bitset_get((ggml_bitset_t *)in_RDI[1],local_28);
    bVar4 = false;
    if (bVar2) {
      bVar4 = *(ggml_tensor **)(in_RDI[2] + local_28 * 8) != in_RSI;
    }
    if (!bVar4) break;
    local_28 = (local_28 + 1) % *in_RDI;
    if (local_28 == sVar3 % uVar1) {
      return 0xffffffffffffffff;
    }
  }
  return local_28;
}

Assistant:

static size_t ggml_hash_find(const struct ggml_hash_set * hash_set, const struct ggml_tensor * key) {
    size_t h = ggml_hash(key) % hash_set->size;

    // linear probing
    size_t i = h;
    while (ggml_bitset_get(hash_set->used, i) && hash_set->keys[i] != key) {
        i = (i + 1) % hash_set->size;
        if (i == h) {
            // visited all hash table entries -> not found
            return GGML_HASHSET_FULL;
        }
    }
    return i;
}